

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O2

int uv_inet_pton(int af,char *src,void *dst)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  uchar *dst_00;
  ushort uVar7;
  char cVar8;
  long local_68;
  uchar *local_60;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_38;
  
  if (af == 10) {
    local_48 = 0;
    uStack_40 = 0;
    cVar8 = *src;
    if (cVar8 == ':') {
      if (src[1] != ':') {
        return -0x16;
      }
      local_38 = (undefined8 *)dst;
      src = src + 1;
    }
    else {
      local_38 = (undefined8 *)dst;
    }
    local_68 = 0;
    iVar1 = 0;
    uVar2 = 0;
    local_60 = (uchar *)0x0;
    local_58 = src;
    local_38 = (undefined8 *)dst;
    while( true ) {
      local_50 = src + 1;
      uVar7 = (ushort)uVar2;
      if (cVar8 == '\0') break;
      pvVar3 = memchr("0123456789abcdef",(int)cVar8,0x11);
      if (pvVar3 == (void *)0x0) {
        pvVar3 = memchr("0123456789ABCDEF",(int)cVar8,0x11);
        lVar4 = local_68;
        if (pvVar3 != (void *)0x0) {
          iVar5 = 0x1150e0;
          goto LAB_001089d5;
        }
        dst_00 = (uchar *)((long)&local_48 + local_68);
        if (cVar8 != ':') {
          if (cVar8 != '.') {
            return -0x16;
          }
          if (0xc < local_68) {
            return -0x16;
          }
          iVar1 = inet_pton4(local_58,dst_00);
          if (iVar1 != 0) {
            return -0x16;
          }
          local_68 = lVar4 + 4;
          goto LAB_00108aa7;
        }
        if (iVar1 == 0) {
          iVar1 = 0;
          local_58 = local_50;
          if (local_60 != (uchar *)0x0) {
            return -0x16;
          }
        }
        else {
          local_58 = local_50;
          if (*local_50 == '\0') {
            return -0x16;
          }
          if (0xe < local_68) {
            return -0x16;
          }
          *(ushort *)((long)&local_48 + local_68) = uVar7 << 8 | uVar7 >> 8;
          local_68 = local_68 + 2;
          iVar1 = 0;
          uVar2 = 0;
          dst_00 = local_60;
        }
      }
      else {
        iVar5 = 0x1150c0;
LAB_001089d5:
        if (3 < iVar1) {
          return -0x16;
        }
        uVar2 = (int)pvVar3 - iVar5 | uVar2 << 4;
        iVar1 = iVar1 + 1;
        dst_00 = local_60;
      }
      cVar8 = *local_50;
      local_60 = dst_00;
      src = local_50;
    }
    if (iVar1 != 0) {
      if (0xe < local_68) {
        return -0x16;
      }
      *(ushort *)((long)&local_48 + local_68) = uVar7 << 8 | uVar7 >> 8;
      local_68 = local_68 + 2;
    }
LAB_00108aa7:
    if (local_60 == (uchar *)0x0) {
      if (local_68 != 0x10) {
        return -0x16;
      }
    }
    else {
      if (local_68 == 0x10) {
        return -0x16;
      }
      uVar2 = ((int)&local_68 + (int)local_68 + 0x20) - (int)local_60;
      lVar4 = 0;
      uVar6 = 0;
      if (0 < (int)uVar2) {
        uVar6 = (ulong)uVar2;
      }
      for (; -lVar4 != uVar6; lVar4 = lVar4 + -1) {
        *(uchar *)((long)&uStack_40 + lVar4 + 7) = local_60[lVar4 + (long)(int)uVar2 + -1];
        local_60[lVar4 + (long)(int)uVar2 + -1] = '\0';
      }
    }
    *local_38 = local_48;
    local_38[1] = uStack_40;
    iVar1 = 0;
  }
  else {
    if (af == 2) {
      iVar1 = inet_pton4(src,(uchar *)dst);
      return iVar1;
    }
    iVar1 = -0x61;
  }
  return iVar1;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6:
    return (inet_pton6(src, dst));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}